

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.hpp
# Opt level: O2

string * __thiscall
yactfr::internal::ReadVarInstrOpt<yactfr::VariantTypeOption<long_long>>::toStr_abi_cxx11_
          (string *__return_storage_ptr__,void *this,Size indent)

{
  long lVar1;
  ostream *poVar2;
  _Rb_tree_node_base *p_Var3;
  Size indent_00;
  ostringstream ss;
  string local_1c8;
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  indent_abi_cxx11_(&local_1c8,(internal *)indent,indent_00);
  poVar2 = std::operator<<((ostream *)local_1a8,(string *)&local_1c8);
  std::operator<<(poVar2,"<var opt>");
  std::__cxx11::string::~string((string *)&local_1c8);
  lVar1 = *this;
  for (p_Var3 = *(_Rb_tree_node_base **)(lVar1 + 0x70);
      p_Var3 != (_Rb_tree_node_base *)(lVar1 + 0x60);
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    poVar2 = std::operator<<((ostream *)local_1a8," [");
    poVar2 = std::ostream::_M_insert<long_long>((longlong)poVar2);
    poVar2 = std::operator<<(poVar2,", ");
    poVar2 = std::ostream::_M_insert<long_long>((longlong)poVar2);
    std::operator<<(poVar2,"]");
  }
  poVar2 = std::endl<char,std::char_traits<char>>((ostream *)local_1a8);
  Proc::toStr_abi_cxx11_(&local_1c8,(Proc *)((long)this + 8),indent + 1);
  std::operator<<(poVar2,(string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string toStr(const Size indent = 0) const
    {
        std::ostringstream ss;

        ss << internal::indent(indent) << "<var opt>";

        for (const auto& range : _opt->selectorRanges()) {
            ss << " [" << range.lower() << ", " << range.upper() << "]";
        }

        ss << std::endl << _proc.toStr(indent + 1);
        return ss.str();
    }